

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CMainMethod *stm)

{
  bool bVar1;
  element_type *peVar2;
  mapped_type *pmVar3;
  pointer pCVar4;
  pointer pCVar5;
  TypeInfo local_a0;
  TypeInfo local_78;
  allocator local_39;
  string local_38 [32];
  CMainMethod *local_18;
  CMainMethod *stm_local;
  CTypeCheckerVisitor *this_local;
  
  local_18 = stm;
  stm_local = (CMainMethod *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: mainmethod\n");
  peVar2 = std::__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ClassInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->currentClass);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"main",&local_39);
  pmVar3 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<MethodInfo>_>_>_>
           ::operator[](&peVar2->methods,(key_type *)local_38);
  std::shared_ptr<MethodInfo>::operator=(&this->currentMethod,pmVar3);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->vars);
  if (bVar1) {
    pCVar4 = std::unique_ptr<CFieldList,_std::default_delete<CFieldList>_>::operator->
                       (&local_18->vars);
    (**(pCVar4->super_IWrapper).super_PositionedNode.super_INode._vptr_INode)(pCVar4,this);
    TypeInfo::TypeInfo(&local_78,VOID);
    TypeInfo::operator=(&this->lastCalculatedType,&local_78);
    TypeInfo::~TypeInfo(&local_78);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->statements);
  if (bVar1) {
    pCVar5 = std::unique_ptr<CCompoundStm,_std::default_delete<CCompoundStm>_>::operator->
                       (&local_18->statements);
    (**(pCVar5->super_IStatement).super_PositionedNode.super_INode._vptr_INode)(pCVar5,this);
    TypeInfo::TypeInfo(&local_a0,VOID);
    TypeInfo::operator=(&this->lastCalculatedType,&local_a0);
    TypeInfo::~TypeInfo(&local_a0);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CMainMethod &stm )
{
	std::cout << "typechecker: mainmethod\n";
    currentMethod = currentClass->methods["main"];
    if( stm.vars ) {
        stm.vars->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    }
    if( stm.statements ) {
        stm.statements->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    }
}